

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O2

BOOL __thiscall
Js::PathTypeHandlerBase::GetProperty
          (PathTypeHandlerBase *this,DynamicObject *instance,Var originalInstance,
          JavascriptString *propertyNameString,Var *value,PropertyValueInfo *info,
          ScriptContext *requestContext)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  RecyclableObject *pRVar5;
  PropertyRecord *local_50;
  PropertyRecord *propertyRecord;
  Var local_40;
  Var *local_38;
  
  propertyRecord = (PropertyRecord *)info;
  local_40 = originalInstance;
  local_38 = value;
  if (requestContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x2cc,"(requestContext)","requestContext");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  bVar2 = DynamicObject::HasObjectArray(instance);
  if (bVar2) {
    ScriptContext::GetOrAddPropertyRecord(requestContext,propertyNameString,&local_50);
  }
  else {
    ScriptContext::FindPropertyRecord(requestContext,propertyNameString,&local_50);
    if (local_50 == (PropertyRecord *)0x0) {
      pRVar5 = ScriptContext::GetMissingPropertyResult(requestContext);
      *local_38 = pRVar5;
      return 0;
    }
  }
  BVar3 = GetProperty(this,instance,local_40,local_50->pid,local_38,
                      (PropertyValueInfo *)propertyRecord,requestContext);
  return BVar3;
}

Assistant:

BOOL PathTypeHandlerBase::GetProperty(DynamicObject* instance, Var originalInstance, JavascriptString* propertyNameString, Var* value, PropertyValueInfo* info, ScriptContext* requestContext)
    {
        // Consider: Implement actual string hash lookup
        Assert(requestContext);
        PropertyRecord const* propertyRecord;

        if (instance->HasObjectArray())
        {
            requestContext->GetOrAddPropertyRecord(propertyNameString, &propertyRecord);
        }
        else
        {
            requestContext->FindPropertyRecord(propertyNameString, &propertyRecord);
            if (propertyRecord == nullptr)
            {
                *value = requestContext->GetMissingPropertyResult();
                return false;
            }
        }
        return PathTypeHandlerBase::GetProperty(instance, originalInstance, propertyRecord->GetPropertyId(), value, info, requestContext);
    }